

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::Texture1DArrayView::sampleOffset
          (Texture1DArrayView *this,Sampler *sampler,float s,float t,float lod,deInt32 offset)

{
  WrapMode WVar1;
  undefined4 numLevels;
  int y_;
  int in_ECX;
  undefined4 in_register_00000014;
  Vec4 VVar2;
  Vector<int,_2> local_38;
  float local_2c;
  deInt32 offset_local;
  float lod_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  Texture1DArrayView *this_local;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  local_2c = lod;
  offset_local = (deInt32)t;
  lod_local = s;
  _t_local = (IVec2 *)CONCAT44(in_register_00000014,offset);
  sampler_local = sampler;
  this_local = this;
  y_ = selectLayer((Texture1DArrayView *)sampler,t);
  Vector<int,_2>::Vector(&local_38,in_ECX,y_);
  VVar2 = sampleLevelArray1DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,lod,
                     (IVec2 *)CONCAT44(in_register_00000014,offset));
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture1DArrayView::sampleOffset (const Sampler& sampler, float s, float t, float lod, deInt32 offset) const
{
	return sampleLevelArray1DOffset(m_levels, m_numLevels, sampler, s, lod, IVec2(offset, selectLayer(t)));
}